

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::AddKeyPubKeyWithDB
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CKey *secret,CPubKey *pubkey)

{
  WalletStorage *pWVar1;
  WalletBatch *pWVar2;
  bool bVar3;
  int iVar4;
  mapped_type *keyMeta;
  long in_FS_OFFSET;
  CScript script;
  PKHash local_dc;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_c8;
  undefined1 local_80;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar4 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x100000000);
  if ((char)iVar4 != '\0') {
    __assert_fail("!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x2e6,
                  "bool wallet::LegacyScriptPubKeyMan::AddKeyPubKeyWithDB(WalletBatch &, const CKey &, const CPubKey &)"
                 );
  }
  pWVar2 = this->encrypted_batch;
  if (pWVar2 == (WalletBatch *)0x0) {
    this->encrypted_batch = batch;
  }
  iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1c])
                    (this,secret,pubkey);
  if ((char)iVar4 == '\0') {
    if (pWVar2 == (WalletBatch *)0x0) {
      this->encrypted_batch = (WalletBatch *)0x0;
    }
    bVar3 = false;
  }
  else {
    if (pWVar2 == (WalletBatch *)0x0) {
      this->encrypted_batch = (WalletBatch *)0x0;
    }
    local_58._16_8_ = 0;
    local_58._24_8_ = 0;
    local_58._0_8_ = (char *)0x0;
    local_58._8_8_ = 0;
    PKHash::PKHash(&local_dc,pubkey);
    local_c8._M_first._M_storage._M_storage[0x10] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10];
    local_c8._M_first._M_storage._M_storage[0x11] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11];
    local_c8._M_first._M_storage._M_storage[0x12] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12];
    local_c8._M_first._M_storage._M_storage[0x13] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13];
    local_c8._M_first._M_storage._M_storage[0] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0];
    local_c8._M_first._M_storage._M_storage[1] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1];
    local_c8._M_first._M_storage._M_storage[2] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2];
    local_c8._M_first._M_storage._M_storage[3] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3];
    local_c8._M_first._M_storage._M_storage[4] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4];
    local_c8._M_first._M_storage._M_storage[5] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5];
    local_c8._M_first._M_storage._M_storage[6] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6];
    local_c8._M_first._M_storage._M_storage[7] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7];
    local_c8._M_first._M_storage._M_storage[8] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8];
    local_c8._M_first._M_storage._M_storage[9] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9];
    local_c8._M_first._M_storage._M_storage[10] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10];
    local_c8._M_first._M_storage._M_storage[0xb] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb];
    local_c8._M_first._M_storage._M_storage[0xc] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc];
    local_c8._M_first._M_storage._M_storage[0xd] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd];
    local_c8._M_first._M_storage._M_storage[0xe] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe];
    local_c8._M_first._M_storage._M_storage[0xf] =
         local_dc.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf];
    local_80 = 2;
    GetScriptForDestination((CScript *)&local_78,(CTxDestination *)&local_c8._M_first);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,&local_78);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_78);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_c8._M_first);
    bVar3 = LegacyDataSPKM::HaveWatchOnly(&this->super_LegacyDataSPKM,(CScript *)local_58);
    if (bVar3) {
      RemoveWatchOnly(this,(CScript *)local_58);
    }
    GetScriptForRawPubKey((CScript *)&local_c8._M_first,pubkey);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
               (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_c8._M_first);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_c8._M_first);
    bVar3 = LegacyDataSPKM::HaveWatchOnly(&this->super_LegacyDataSPKM,(CScript *)local_58);
    if (bVar3) {
      RemoveWatchOnly(this,(CScript *)local_58);
    }
    pWVar1 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    (*pWVar1->_vptr_WalletStorage[5])(pWVar1,batch);
    iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[9]
            )();
    bVar3 = true;
    if ((char)iVar4 == '\0') {
      CKey::GetPrivKey((CPrivKey *)&local_c8._M_first,secret);
      CPubKey::GetID((CKeyID *)&local_78,pubkey);
      keyMeta = std::
                map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,(key_type *)&local_78);
      bVar3 = WalletBatch::WriteKey(batch,pubkey,(CPrivKey *)&local_c8._M_first,keyMeta);
      std::_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_secure_allocator<unsigned_char>_> *)&local_c8._M_first
                );
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::AddKeyPubKeyWithDB(WalletBatch& batch, const CKey& secret, const CPubKey& pubkey)
{
    AssertLockHeld(cs_KeyStore);

    // Make sure we aren't adding private keys to private key disabled wallets
    assert(!m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS));

    // FillableSigningProvider has no concept of wallet databases, but calls AddCryptedKey
    // which is overridden below.  To avoid flushes, the database handle is
    // tunneled through to it.
    bool needsDB = !encrypted_batch;
    if (needsDB) {
        encrypted_batch = &batch;
    }
    if (!AddKeyPubKeyInner(secret, pubkey)) {
        if (needsDB) encrypted_batch = nullptr;
        return false;
    }
    if (needsDB) encrypted_batch = nullptr;

    // check if we need to remove from watch-only
    CScript script;
    script = GetScriptForDestination(PKHash(pubkey));
    if (HaveWatchOnly(script)) {
        RemoveWatchOnly(script);
    }
    script = GetScriptForRawPubKey(pubkey);
    if (HaveWatchOnly(script)) {
        RemoveWatchOnly(script);
    }

    m_storage.UnsetBlankWalletFlag(batch);
    if (!m_storage.HasEncryptionKeys()) {
        return batch.WriteKey(pubkey,
                                                 secret.GetPrivKey(),
                                                 mapKeyMetadata[pubkey.GetID()]);
    }
    return true;
}